

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

bool __thiscall Tester::testFile(Tester *this,string *filename)

{
  bool bVar1;
  error_category *peVar2;
  pointer *this_00;
  error_code eVar3;
  allocator<char> local_251;
  string local_250;
  reference local_230;
  Message *m_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_> *__range1_1;
  string local_208;
  reference local_1e8;
  Message *m;
  iterator __end1;
  iterator __begin1;
  vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_> *__range1;
  DifferenceReport diff;
  string local_190;
  char *local_170;
  allocator<char> local_161;
  string local_160;
  undefined1 local_140 [8];
  error_code ec;
  string local_110;
  undefined1 local_f0 [8];
  Parser p;
  BufferedReport expected;
  undefined1 local_40 [8];
  BufferedReport actual;
  string *filename_local;
  Tester *this_local;
  
  actual.messages_.
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)filename;
  flow::diagnostics::BufferedReport::BufferedReport((BufferedReport *)local_40);
  compileFile(this,(string *)
                   actual.messages_.
                   super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(Report *)local_40);
  flow::diagnostics::BufferedReport::BufferedReport
            ((BufferedReport *)((long)&p.lexer_.stringValue_.field_2 + 8));
  std::__cxx11::string::string
            ((string *)&local_110,
             (string *)
             actual.messages_.
             super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  readFile((string *)&ec._M_cat,
           (string *)
           actual.messages_.
           super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  flowtest::Parser::Parser((Parser *)local_f0,&local_110,(string *)&ec._M_cat);
  std::__cxx11::string::~string((string *)&ec._M_cat);
  std::__cxx11::string::~string((string *)&local_110);
  eVar3 = flowtest::Parser::parse
                    ((Parser *)local_f0,(Report *)((long)&p.lexer_.stringValue_.field_2 + 8));
  ec._0_8_ = eVar3._M_cat;
  local_140._0_4_ = eVar3._M_value;
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_140);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"Parse Error({}): {}",&local_161);
    peVar2 = std::error_code::category((error_code *)local_140);
    local_170 = (char *)(**(code **)(*(long *)peVar2 + 0x10))();
    std::error_code::message_abi_cxx11_(&local_190,(error_code *)local_140);
    reportError<char_const*,std::__cxx11::string>(this,&local_160,&local_170,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
    this_local._7_1_ = false;
    diff.second.
    super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    flow::diagnostics::difference
              ((DifferenceReport *)&__range1,(BufferedReport *)local_40,
               (BufferedReport *)((long)&p.lexer_.stringValue_.field_2 + 8));
    __end1 = std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>::
             begin((vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
                    *)&__range1);
    m = (Message *)
        std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>::end
                  ((vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
                    *)&__range1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<flow::diagnostics::Message_*,_std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>_>
                                       *)&m), bVar1) {
      local_1e8 = __gnu_cxx::
                  __normal_iterator<flow::diagnostics::Message_*,_std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>_>
                  ::operator*(&__end1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"Missing: {}",(allocator<char> *)((long)&__range1_1 + 7));
      reportError<flow::diagnostics::Message_const&>(this,&local_208,local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_1 + 7));
      __gnu_cxx::
      __normal_iterator<flow::diagnostics::Message_*,_std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>_>
      ::operator++(&__end1);
    }
    this_00 = &diff.first.
               super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end1_1 = std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
               ::begin((vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
                        *)this_00);
    m_1 = (Message *)
          std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>::end
                    ((vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
                      *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<flow::diagnostics::Message_*,_std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>_>
                               *)&m_1), bVar1) {
      local_230 = __gnu_cxx::
                  __normal_iterator<flow::diagnostics::Message_*,_std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>_>
                  ::operator*(&__end1_1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,"Superfluous: {}",&local_251);
      reportError<flow::diagnostics::Message_const&>(this,&local_250,local_230);
      std::__cxx11::string::~string((string *)&local_250);
      std::allocator<char>::~allocator(&local_251);
      __gnu_cxx::
      __normal_iterator<flow::diagnostics::Message_*,_std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>_>
      ::operator++(&__end1_1);
    }
    bVar1 = flow::diagnostics::BufferedReport::operator!=
                      ((BufferedReport *)local_40,
                       (BufferedReport *)((long)&p.lexer_.stringValue_.field_2 + 8));
    this_local._7_1_ = !bVar1;
    diff.second.
    super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    std::
    pair<std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>,_std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>_>
    ::~pair((pair<std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>,_std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>_>
             *)&__range1);
  }
  flowtest::Parser::~Parser((Parser *)local_f0);
  flow::diagnostics::BufferedReport::~BufferedReport
            ((BufferedReport *)((long)&p.lexer_.stringValue_.field_2 + 8));
  flow::diagnostics::BufferedReport::~BufferedReport((BufferedReport *)local_40);
  return this_local._7_1_;
}

Assistant:

bool Tester::testFile(const std::string& filename) {
  flow::diagnostics::BufferedReport actual;
  compileFile(filename, &actual);

  flow::diagnostics::BufferedReport expected;
  Parser p(filename, readFile(filename));
  std::error_code ec = p.parse(&expected);
  if (ec) {
    reportError("Parse Error({}): {}", ec.category().name(), ec.message());
    return false;
  }

  flow::diagnostics::DifferenceReport diff = flow::diagnostics::difference(actual, expected);
  for (const Message& m : diff.first)
    reportError("Missing: {}", m);
  for (const Message& m : diff.second)
    reportError("Superfluous: {}", m);

  if (actual != expected)
    return false;

  return true;
}